

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256_leaf.cpp
# Opt level: O2

bool __thiscall duckdb::Node256Leaf::GetNextByte(Node256Leaf *this,uint8_t *byte)

{
  ulong uVar1;
  ValidityMask v_mask;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_18;
  undefined8 local_10;
  
  _Stack_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_10 = 0x100;
  uVar1 = (ulong)*byte;
  do {
    if (uVar1 == 0x100) {
LAB_01a177af:
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_18);
      return uVar1 < 0x100;
    }
    if ((this->mask[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) != 0) {
      *byte = (uint8_t)uVar1;
      goto LAB_01a177af;
    }
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

bool Node256Leaf::GetNextByte(uint8_t &byte) {
	ValidityMask v_mask(&mask[0], Node256::CAPACITY);
	for (uint16_t i = byte; i < CAPACITY; i++) {
		if (v_mask.RowIsValid(i)) {
			byte = UnsafeNumericCast<uint8_t>(i);
			return true;
		}
	}
	return false;
}